

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Run(BasicInputBase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  GLuint GVar9;
  reference data_00;
  float *pfVar10;
  long lVar11;
  long lVar12;
  Vector<float,_4> *local_518;
  Vector<float,_4> local_4f4;
  uint local_4e4;
  BasicInputBase *pBStack_4e0;
  int i;
  long status;
  Vec4 data [64];
  allocator<unsigned_char> local_c1;
  undefined1 local_c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zero;
  GLchar *v [16];
  char *pcStack_20;
  GLuint sh;
  char *glsl_vs;
  BasicInputBase *this_local;
  
  pcStack_20 = 
  "#version 430 core\nlayout(location = 0) in vec4 vs_in_attrib[16];\nout StageData {\n  vec4 attrib[16];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attrib.length(); ++i) {\n    vs_out.attrib[i] = vs_in_attrib[i];\n  }\n}"
  ;
  glsl_vs = (char *)this;
  GVar9 = glu::CallLogWrapper::glCreateProgram
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  this->m_po = GVar9;
  GVar9 = glu::CallLogWrapper::glCreateShader
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar9,1,&stack0xffffffffffffffe0,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar9);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,GVar9);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar9);
  memcpy(&zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&PTR_anon_var_dwarf_2b427b_032380e0,0x80);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po,0x10,
             (GLchar **)
             &zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x8c8c);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po);
  bVar8 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  if (bVar8) {
    std::allocator<unsigned_char>::allocator(&local_c1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,0x400,&local_c1);
    std::allocator<unsigned_char>::~allocator(&local_c1);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->m_xfbo);
    data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x400,data_00,0x88e8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
    glu::CallLogWrapper::glEnable
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_po);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    if (this->base_instance == -1) {
      glu::CallLogWrapper::glDrawArraysInstanced
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,2,this->instance_count);
    }
    else {
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,2,this->instance_count,this->base_instance);
    }
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    local_518 = (Vector<float,_4> *)&status;
    do {
      tcu::Vector<float,_4>::Vector(local_518);
      local_518 = local_518 + 1;
    } while (local_518 != (Vector<float,_4> *)(data[0x3f].m_data + 2));
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,0x400,&status);
    pBStack_4e0 = (BasicInputBase *)0x0;
    for (local_4e4 = 0; (int)local_4e4 < 0x40; local_4e4 = local_4e4 + 1) {
      lVar11 = (long)(int)local_4e4;
      lVar12 = (long)(int)local_4e4;
      tcu::Vector<float,_4>::Vector(&local_4f4,0.01);
      bVar8 = VertexAttribBindingBase::ColorEqual
                        (&this->super_VertexAttribBindingBase,this->expected_data + lVar11,
                         (Vec4 *)(data[lVar12 + -1].m_data + 2),&local_4f4);
      if (((bVar8 ^ 0xffU) & 1) != 0) {
        pfVar10 = tcu::Vector<float,_4>::operator[]
                            ((Vector<float,_4> *)(data[(long)(int)local_4e4 + -1].m_data + 2),0);
        fVar1 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[]
                            ((Vector<float,_4> *)(data[(long)(int)local_4e4 + -1].m_data + 2),1);
        fVar2 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[]
                            ((Vector<float,_4> *)(data[(long)(int)local_4e4 + -1].m_data + 2),2);
        fVar3 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[]
                            ((Vector<float,_4> *)(data[(long)(int)local_4e4 + -1].m_data + 2),3);
        fVar4 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[](this->expected_data + (int)local_4e4,0);
        fVar5 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[](this->expected_data + (int)local_4e4,1);
        fVar6 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[](this->expected_data + (int)local_4e4,2);
        fVar7 = *pfVar10;
        pfVar10 = tcu::Vector<float,_4>::operator[](this->expected_data + (int)local_4e4,3);
        anon_unknown_0::Output
                  ("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n",
                   (double)fVar1,(double)fVar2,(double)fVar3,(double)fVar4,(double)fVar5,
                   (double)fVar6,(double)fVar7,(double)*pfVar10,(ulong)local_4e4);
        pBStack_4e0 = (BasicInputBase *)&DAT_ffffffffffffffff;
        break;
      }
    }
    this_local = pBStack_4e0;
  }
  else {
    this_local = (BasicInputBase *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "layout(location = 0) in vec4 vs_in_attrib[16];" NL
									"out StageData {" NL "  vec4 attrib[16];" NL "} vs_out;" NL "void main() {" NL
									"  for (int i = 0; i < vs_in_attrib.length(); ++i) {" NL
									"    vs_out.attrib[i] = vs_in_attrib[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attrib[0]",  "StageData.attrib[1]",  "StageData.attrib[2]",
										  "StageData.attrib[3]",  "StageData.attrib[4]",  "StageData.attrib[5]",
										  "StageData.attrib[6]",  "StageData.attrib[7]",  "StageData.attrib[8]",
										  "StageData.attrib[9]",  "StageData.attrib[10]", "StageData.attrib[11]",
										  "StageData.attrib[12]", "StageData.attrib[13]", "StageData.attrib[14]",
										  "StageData.attrib[15]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(sizeof(expected_data));
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(expected_data), &zero[0], GL_DYNAMIC_DRAW);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		if (base_instance != -1)
		{
			glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, static_cast<GLuint>(base_instance));
		}
		else
		{
			glDrawArraysInstanced(GL_POINTS, 0, 2, instance_count);
		}
		glEndTransformFeedback();

		Vec4 data[64];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(Vec4) * 64, &data[0]);

		long status = NO_ERROR;
		for (int i = 0; i < 64; ++i)
		{
			if (!ColorEqual(expected_data[i], data[i], Vec4(0.01f)))
			{
				Output("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n", data[i][0], data[i][1],
					   data[i][2], data[i][3], expected_data[i][0], expected_data[i][1], expected_data[i][2],
					   expected_data[i][3], i);
				status = ERROR;
				break;
			}
		}
		return status;
	}